

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAi_kry.c
# Opt level: O0

int fB(sunrealtype t,N_Vector c,N_Vector cB,N_Vector cBdot,void *user_data)

{
  WebData in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunrealtype in_XMM0_Qa;
  sunrealtype gu [6];
  WebData wdata;
  sunrealtype *cBdotdata;
  sunrealtype *cBdata;
  sunrealtype *cdata;
  sunrealtype dy;
  sunrealtype dx;
  sunrealtype *fBsave;
  sunrealtype *fsave;
  sunrealtype *coy;
  sunrealtype *cox;
  sunrealtype y;
  sunrealtype x;
  sunrealtype dcyui;
  sunrealtype dcyli;
  sunrealtype dcxui;
  sunrealtype dcxli;
  int mxns;
  int ns;
  int jy;
  int jx;
  int iyoff;
  int idyu;
  int idyl;
  int idxu;
  int idxl;
  int ici;
  int ic;
  int i;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  double adStack_108 [5];
  undefined8 local_e0;
  WebData local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  sunrealtype local_b8;
  sunrealtype local_b0;
  sunrealtype *local_a8;
  sunrealtype *local_a0;
  sunrealtype *local_98;
  sunrealtype *local_90;
  sunrealtype local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 local_20;
  undefined8 local_18;
  sunrealtype local_8;
  
  local_d8 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_8 = in_XMM0_Qa;
  local_c0 = N_VGetArrayPointer(in_RDI);
  local_c8 = N_VGetArrayPointer(local_18);
  local_d0 = N_VGetArrayPointer(local_20);
  local_54 = local_d8->ns;
  local_a0 = local_d8->fsave;
  local_a8 = local_d8->fBsave;
  local_90 = local_d8->cox;
  local_98 = local_d8->coy;
  local_58 = local_d8->mxns;
  local_b0 = local_d8->dx;
  local_b8 = local_d8->dy;
  for (local_2c = 0; local_2c < local_54; local_2c = local_2c + 1) {
    adStack_108[local_2c] = 0.0;
  }
  local_e0 = 0x3ff0000000000000;
  for (local_50 = 0; local_50 < 0x14; local_50 = local_50 + 1) {
    local_88 = (double)local_50 * local_b8;
    local_48 = local_58 * local_50;
    if (local_50 == 0x13) {
      local_10c = -local_58;
    }
    else {
      local_10c = local_58;
    }
    local_44 = local_10c;
    if (local_50 == 0) {
      local_110 = -local_58;
    }
    else {
      local_110 = local_58;
    }
    local_40 = local_110;
    for (local_4c = 0; local_4c < 0x14; local_4c = local_4c + 1) {
      local_80 = (double)local_4c * local_b0;
      local_30 = local_48 + local_54 * local_4c;
      WebRatesB(local_80,local_88,local_8,(sunrealtype *)(local_c0 + (long)local_30 * 8),
                (sunrealtype *)(local_c8 + (long)local_30 * 8),local_a0 + local_30,
                local_a8 + local_30,local_d8);
      if (local_4c == 0x13) {
        local_114 = -local_54;
      }
      else {
        local_114 = local_54;
      }
      local_3c = local_114;
      if (local_4c == 0) {
        local_118 = -local_54;
      }
      else {
        local_118 = local_54;
      }
      local_38 = local_118;
      for (local_2c = 1; local_2c <= local_54; local_2c = local_2c + 1) {
        local_34 = local_30 + local_2c + -1;
        local_70 = *(double *)(local_c8 + (long)local_34 * 8) -
                   *(double *)(local_c8 + (long)(local_34 - local_40) * 8);
        local_78 = *(double *)(local_c8 + (long)(local_34 + local_44) * 8) -
                   *(double *)(local_c8 + (long)local_34 * 8);
        local_60 = *(double *)(local_c8 + (long)local_34 * 8) -
                   *(double *)(local_c8 + (long)(local_34 - local_118) * 8);
        local_68 = *(double *)(local_c8 + (long)(local_34 + local_114) * 8) -
                   *(double *)(local_c8 + (long)local_34 * 8);
        *(double *)(local_d0 + (long)local_34 * 8) =
             ((-local_98[local_2c + -1] * (local_78 - local_70) +
              -(local_90[local_2c + -1] * (local_68 - local_60))) - local_a8[local_34]) -
             adStack_108[local_2c + -1];
      }
    }
  }
  return 0;
}

Assistant:

static int fB(sunrealtype t, N_Vector c, N_Vector cB, N_Vector cBdot,
              void* user_data)
{
  int i, ic, ici, idxl, idxu, idyl, idyu, iyoff, jx, jy, ns, mxns;
  sunrealtype dcxli, dcxui, dcyli, dcyui, x, y, *cox, *coy, *fsave, *fBsave, dx,
    dy;
  sunrealtype *cdata, *cBdata, *cBdotdata;
  WebData wdata;

  sunrealtype gu[NS];

  wdata     = (WebData)user_data;
  cdata     = N_VGetArrayPointer(c);
  cBdata    = N_VGetArrayPointer(cB);
  cBdotdata = N_VGetArrayPointer(cBdot);

  mxns   = wdata->mxns;
  ns     = wdata->ns;
  fsave  = wdata->fsave;
  fBsave = wdata->fBsave;
  cox    = wdata->cox;
  coy    = wdata->coy;
  mxns   = wdata->mxns;
  dx     = wdata->dx;
  dy     = wdata->dy;

  for (i = 0; i < ns; i++) { gu[i] = ZERO; }
  gu[ISPEC - 1] = ONE;

  for (jy = 0; jy < MY; jy++)
  {
    y     = jy * dy;
    iyoff = mxns * jy;
    idyu  = (jy == MY - 1) ? -mxns : mxns;
    idyl  = (jy == 0) ? -mxns : mxns;
    for (jx = 0; jx < MX; jx++)
    {
      x  = jx * dx;
      ic = iyoff + ns * jx;
      /* Get interaction rates at one point (x,y). */
      WebRatesB(x, y, t, cdata + ic, cBdata + ic, fsave + ic, fBsave + ic, wdata);
      idxu = (jx == MX - 1) ? -ns : ns;
      idxl = (jx == 0) ? -ns : ns;
      for (i = 1; i <= ns; i++)
      {
        ici = ic + i - 1;
        /* Do differencing in y. */
        dcyli = cBdata[ici] - cBdata[ici - idyl];
        dcyui = cBdata[ici + idyu] - cBdata[ici];
        /* Do differencing in x. */
        dcxli = cBdata[ici] - cBdata[ici - idxl];
        dcxui = cBdata[ici + idxu] - cBdata[ici];
        /* Collect terms and load cdot elements. */
        cBdotdata[ici] = -coy[i - 1] * (dcyui - dcyli) -
                         cox[i - 1] * (dcxui - dcxli) - fBsave[ici] - gu[i - 1];
      }
    }
  }

  return (0);
}